

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O2

void google::LogDestination::FlushLogFiles(int min_severity)

{
  LogDestination *pLVar1;
  int i;
  undefined8 unaff_RBX;
  
  std::mutex::lock((mutex *)log_mutex);
  for (; min_severity < 4; min_severity = min_severity + 1) {
    pLVar1 = log_destination((LogSeverity)((ulong)unaff_RBX >> 0x20));
    if (pLVar1 != (LogDestination *)0x0) {
      (*pLVar1->logger_->_vptr_Logger[4])();
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)log_mutex);
  return;
}

Assistant:

inline void LogDestination::FlushLogFiles(int min_severity) {
  // Prevent any subtle race conditions by wrapping a mutex lock around
  // all this stuff.
  std::lock_guard<std::mutex> l{log_mutex};
  for (int i = min_severity; i < NUM_SEVERITIES; i++) {
    LogDestination* log = log_destination(static_cast<LogSeverity>(i));
    if (log != nullptr) {
      log->logger_->Flush();
    }
  }
}